

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# audio-logger.cpp
# Opt level: O1

bool __thiscall AudioLogger::record(AudioLogger *this,float bufferSize_s,int32_t nPrevFrames)

{
  _Head_base<0UL,_AudioLogger::Data_*,_false> _Var1;
  iterator __position;
  bool bVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  array<float,_512UL> *__args;
  undefined8 uVar6;
  uint uVar7;
  ulong uVar8;
  ulong uVar9;
  vector<std::array<float,512ul>,std::allocator<std::array<float,512ul>>> *this_00;
  float fVar10;
  pthread_mutex_t *local_40;
  
  uVar8 = (ulong)(uint)nPrevFrames;
  _Var1._M_head_impl =
       (this->data_)._M_t.
       super___uniq_ptr_impl<AudioLogger::Data,_std::default_delete<AudioLogger::Data>_>._M_t.
       super__Tuple_impl<0UL,_AudioLogger::Data_*,_std::default_delete<AudioLogger::Data>_>.
       super__Head_base<0UL,_AudioLogger::Data_*,_false>._M_head_impl;
  local_40 = (pthread_mutex_t *)CONCAT44(local_40._4_4_,bufferSize_s);
  bVar2 = isValidBufferSize(this,bufferSize_s);
  if (bVar2) {
    fVar10 = (float)*(int64_t *)((long)&(_Var1._M_head_impl)->parameters + 0x28) * bufferSize_s *
             0.001953125;
    iVar3 = (int)fVar10 + (uint)(0.0 < fVar10 && (float)(int)fVar10 != fVar10);
    uVar7 = iVar3 - (iVar3 >> 0x1f) & 0xfffffffe;
    if ((int)uVar7 < nPrevFrames) {
      bVar2 = false;
      fprintf(_stderr,
              "warning : invalid previous frames in record requested - %d. max allowed is %d s\n",
              uVar8);
    }
    else {
      iVar3 = pthread_mutex_lock((pthread_mutex_t *)&(_Var1._M_head_impl)->mutex);
      if (iVar3 != 0) {
        uVar6 = std::__throw_system_error(iVar3);
        pthread_mutex_unlock(local_40);
        _Unwind_Resume(uVar6);
      }
      lVar5 = (long)(_Var1._M_head_impl)->nRecords;
      bVar2 = lVar5 != 0x10;
      if (lVar5 == 0x10) {
        record();
      }
      else {
        if (*(pointer *)((long)&(_Var1._M_head_impl)->records + lVar5 * 0x18 + 8U) ==
            *(pointer *)((long)&(_Var1._M_head_impl)->records + lVar5 * 0x18)) {
          if (0 < nPrevFrames) {
            this_00 = (vector<std::array<float,512ul>,std::allocator<std::array<float,512ul>>> *)
                      ((long)&(_Var1._M_head_impl)->records + lVar5 * 0x18);
            iVar4 = (_Var1._M_head_impl)->bufferId - nPrevFrames;
            iVar3 = iVar4 + 0x3ab;
            if (-1 < iVar4) {
              iVar3 = iVar4;
            }
            uVar9 = (ulong)iVar3;
            lVar5 = (long)&(_Var1._M_head_impl)->buffer + uVar9 * 0x800;
            do {
              __args = (array<float,_512UL> *)((uVar9 / 0x3ab) * -0x1d5800 + lVar5);
              __position._M_current = *(array<float,_512UL> **)(this_00 + 8);
              if (__position._M_current == *(array<float,_512UL> **)(this_00 + 0x10)) {
                std::vector<std::array<float,512ul>,std::allocator<std::array<float,512ul>>>::
                _M_realloc_insert<std::array<float,512ul>const&>(this_00,__position,__args);
              }
              else {
                memcpy(__position._M_current,__args,0x800);
                *(long *)(this_00 + 8) = *(long *)(this_00 + 8) + 0x800;
              }
              lVar5 = lVar5 + 0x800;
              uVar9 = uVar9 + 1;
              uVar8 = uVar8 - 1;
            } while (uVar8 != 0);
          }
        }
        else {
          record();
        }
        *(uint *)((long)&(_Var1._M_head_impl)->nFramesToRecord +
                 (long)(_Var1._M_head_impl)->nRecords * 4) = (uVar7 - nPrevFrames) + 1;
        (_Var1._M_head_impl)->nRecords = (_Var1._M_head_impl)->nRecords + 1;
      }
      pthread_mutex_unlock((pthread_mutex_t *)&(_Var1._M_head_impl)->mutex);
    }
  }
  else {
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool AudioLogger::record(float bufferSize_s, int32_t nPrevFrames) {
    auto & data = getData();

    if (isValidBufferSize(bufferSize_s) == false) {
        return false;
    }

    auto bufferSize_frames = getBufferSize_frames(data.parameters.sampleRate, bufferSize_s);

    if (nPrevFrames >= bufferSize_frames) {
        fprintf(stderr, "warning : invalid previous frames in record requested - %d. max allowed is %d s\n", nPrevFrames, bufferSize_frames - 1);
        return false;
    }

    std::lock_guard<std::mutex> lock(data.mutex);

    if (data.nRecords == kMaxRecords) {
        fprintf(stderr, "warning : max number of simultaneous records %d reached\n", kMaxRecords);
        return false;
    }

    auto & record = data.records[data.nRecords];

    if (record.size() == 0) {
        int fStart = data.bufferId - nPrevFrames;
        if (fStart < 0) fStart += data.buffer.size();
        for (int i = 0; i < nPrevFrames; ++i) {
            record.push_back(data.buffer[(fStart + i)%data.buffer.size()]);
        }
    } else {
        fprintf(stderr, "warning : new record requested before last has been processed. should never happen\n");
    }

    data.nFramesToRecord[data.nRecords] = bufferSize_frames - nPrevFrames;

    ++data.nRecords;

    return true;
}